

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O0

GetElementPtrInst *
GetElementPtrInst::create_gep
          (Value *ptr,vector<Value_*,_std::allocator<Value_*>_> *idxs,BasicBlock *bb)

{
  vector<Value_*,_std::allocator<Value_*>_> *ptr_00;
  GetElementPtrInst *this;
  vector<Value_*,_std::allocator<Value_*>_> local_38;
  BasicBlock *local_20;
  BasicBlock *bb_local;
  vector<Value_*,_std::allocator<Value_*>_> *idxs_local;
  Value *ptr_local;
  
  local_20 = bb;
  bb_local = (BasicBlock *)idxs;
  idxs_local = (vector<Value_*,_std::allocator<Value_*>_> *)ptr;
  this = (GetElementPtrInst *)operator_new(0x90);
  ptr_00 = idxs_local;
  std::vector<Value_*,_std::allocator<Value_*>_>::vector(&local_38,idxs);
  GetElementPtrInst(this,(Value *)ptr_00,&local_38,local_20);
  std::vector<Value_*,_std::allocator<Value_*>_>::~vector(&local_38);
  return this;
}

Assistant:

GetElementPtrInst *GetElementPtrInst::create_gep(Value *ptr, std::vector<Value *> idxs, BasicBlock *bb)
{
    return new GetElementPtrInst(ptr, idxs, bb);
}